

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

size_t decode_ber_longform_integer(uint8_t *buf,long *decoded_integer,int max_len)

{
  byte bVar1;
  size_t sVar2;
  long running_length;
  ulong uVar3;
  
  sVar2 = 1;
  uVar3 = 0;
  while( true ) {
    bVar1 = buf[sVar2 - 1];
    if (((-1 < (char)bVar1) || (max_len <= (int)sVar2)) || (0x7ffffffe < (long)uVar3)) break;
    uVar3 = (uVar3 | bVar1 & 0x7f) << 7;
    sVar2 = sVar2 + 1;
  }
  *decoded_integer = uVar3 + bVar1;
  return sVar2;
}

Assistant:

static size_t decode_ber_longform_integer(const uint8_t* buf, long* decoded_integer, int max_len){
    int i = 1;
    long running_length = 0;
    while(*buf >= 128 && i < max_len && running_length < INT_MAX){
        running_length += *buf & 0x7F;
        running_length *= 128;
        buf++;
        i++;
    }
    running_length += *buf; // the lone byte
    *decoded_integer = running_length;
    return i;
}